

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O0

void __thiscall CConsoleNetConnection::Reset(CConsoleNetConnection *this)

{
  undefined4 *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  *in_RDI = 0;
  mem_zero(in_RDI,in_stack_ffffffffffffffec);
  *(undefined1 *)(in_RDI + 0x169) = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0xffffffff;
  in_RDI[9] = 0xffffffff;
  *(undefined1 *)(in_RDI + 10) = 0;
  in_RDI[0x168] = 0;
  *(undefined1 *)(in_RDI + 0x1a9) = 0;
  *(undefined1 *)((long)in_RDI + 0x6a5) = 10;
  *(undefined1 *)((long)in_RDI + 0x6a6) = 0;
  *(undefined1 *)((long)in_RDI + 0x6a7) = 0;
  return;
}

Assistant:

void CConsoleNetConnection::Reset()
{
	m_State = NET_CONNSTATE_OFFLINE;
	mem_zero(&m_PeerAddr, sizeof(m_PeerAddr));
	m_aErrorString[0] = 0;

	m_Socket.type = NETTYPE_INVALID;
	m_Socket.ipv4sock = -1;
	m_Socket.ipv6sock = -1;
	m_aBuffer[0] = 0;
	m_BufferOffset = 0;

	m_LineEndingDetected = false;
	#if defined(CONF_FAMILY_WINDOWS)
		m_aLineEnding[0] = '\r';
		m_aLineEnding[1] = '\n';
		m_aLineEnding[2] = 0;
	#else
		m_aLineEnding[0] = '\n';
		m_aLineEnding[1] = 0;
		m_aLineEnding[2] = 0;
	#endif
}